

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int __thiscall CVmObjDate::compare_to(CVmObjDate *this,vm_obj_id_t param_1,vm_val_t *val)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  
  if (val->typ == VM_OBJ) {
    iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                   [(val->val).obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                       metaclass_reg_);
    if (iVar3 != 0) {
      piVar1 = (int *)(this->super_CVmObject).ext_;
      piVar2 = *(int **)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc][(val->val).obj & 0xfff].
                                ptr_ + 8);
      iVar3 = *piVar1 - *piVar2;
      if (iVar3 == 0) {
        iVar3 = piVar1[1] - piVar2[1];
      }
      return iVar3;
    }
  }
  err_throw(0x7d9);
}

Assistant:

int CVmObjDate::compare_to(VMG_ vm_obj_id_t, const vm_val_t *val) const
{
    /* check the other object's type */
    if (val->typ == VM_OBJ && is_date_obj(vmg_ val->val.obj))
    {
        /* it's a Date - get the two day number and time values */
        CVmObjDate *vdate = (CVmObjDate *)vm_objp(vmg_ val->val.obj);
        int32_t day1 = get_ext()->dayno, day2 = vdate->get_ext()->dayno;
        int32_t time1 = get_ext()->daytime, time2 = vdate->get_ext()->daytime;

        /* compare by date and time */
        return (day1 != day2 ? day1 - day2 : time1 - time2);
    }
    else
    {
        /* we can't compare to other types */
        err_throw(VMERR_INVALID_COMPARISON);
        AFTER_ERR_THROW(return 0;)
    }
}